

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

char * google::protobuf::ParsePackedField
                 (FieldDescriptor *field,Message *msg,Reflection *reflection,char *ptr,
                 ParseContext *ctx)

{
  Type TVar1;
  Syntax SVar2;
  FileDescriptor *this;
  LogMessage *pLVar3;
  InternalMetadataWithArena *metadata;
  FieldDescriptor *in_RDI;
  void *object;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Reflection *in_stack_ffffffffffffff30;
  LogLevel_conflict in_stack_ffffffffffffff3c;
  FieldDescriptor *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff80;
  _func_bool_void_ptr_int *in_stack_ffffffffffffff88;
  ParseContext *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  char *local_8;
  
  TVar1 = FieldDescriptor::type(in_stack_ffffffffffffff40);
  metadata = (InternalMetadataWithArena *)(ulong)(TVar1 - TYPE_DOUBLE);
  switch(metadata) {
  case (InternalMetadataWithArena *)0x0:
    Reflection::MutableRepeatedField<double>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426e36);
    local_8 = internal::PackedDoubleParser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426e4e);
    break;
  case (InternalMetadataWithArena *)0x1:
    Reflection::MutableRepeatedField<float>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426df4);
    local_8 = internal::PackedFloatParser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426e0c);
    break;
  case (InternalMetadataWithArena *)0x2:
    Reflection::MutableRepeatedField<long>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426a62);
    local_8 = internal::PackedInt64Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426a7a);
    break;
  case (InternalMetadataWithArena *)0x3:
    Reflection::MutableRepeatedField<unsigned_long>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426b6a);
    local_8 = internal::PackedUInt64Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426b82);
    break;
  case (InternalMetadataWithArena *)0x4:
    Reflection::MutableRepeatedField<int>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426a20);
    local_8 = internal::PackedInt32Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426a38);
    break;
  case (InternalMetadataWithArena *)0x5:
    Reflection::MutableRepeatedField<unsigned_long>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426d2e);
    local_8 = internal::PackedFixed64Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426d46);
    break;
  case (InternalMetadataWithArena *)0x6:
    Reflection::MutableRepeatedField<unsigned_int>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426cec);
    local_8 = internal::PackedFixed32Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426d04);
    break;
  case (InternalMetadataWithArena *)0x7:
    Reflection::MutableRepeatedField<bool>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426bac);
    local_8 = internal::PackedBoolParser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426bc4);
    break;
  default:
    pLVar3 = (LogMessage *)&stack0xffffffffffffff90;
    internal::LogMessage::LogMessage
              (pLVar3,in_stack_ffffffffffffff3c,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    FieldDescriptor::type((FieldDescriptor *)pLVar3);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    internal::LogFinisher::operator=
              ((LogFinisher *)pLVar3,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x426ed6);
    local_8 = (char *)0x0;
    break;
  case (InternalMetadataWithArena *)0xc:
    Reflection::MutableRepeatedField<unsigned_int>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426b28);
    local_8 = internal::PackedUInt32Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426b40);
    break;
  case (InternalMetadataWithArena *)0xd:
    internal::ReflectionAccessor::GetRepeatedEnum
              (in_stack_ffffffffffffff30,
               (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (Message *)0x426bee);
    this = FieldDescriptor::file(in_RDI);
    SVar2 = FileDescriptor::syntax(this);
    if (SVar2 == SYNTAX_PROTO3) {
      local_8 = internal::PackedEnumParser
                          (in_stack_ffffffffffffff30,
                           (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (ParseContext *)0x426c2d);
    }
    else {
      FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffff30);
      internal::ReflectionAccessor::MutableInternalMetadataWithArena
                (in_stack_ffffffffffffff30,
                 (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      FieldDescriptor::number(in_RDI);
      local_8 = internal::PackedEnumParserArg
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80,metadata,in_stack_ffffffffffffffb0);
    }
    break;
  case (InternalMetadataWithArena *)0xe:
    Reflection::MutableRepeatedField<int>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426d70);
    local_8 = internal::PackedSFixed32Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426d88);
    break;
  case (InternalMetadataWithArena *)0xf:
    Reflection::MutableRepeatedField<long>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426db2);
    local_8 = internal::PackedSFixed64Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426dca);
    break;
  case (InternalMetadataWithArena *)0x10:
    Reflection::MutableRepeatedField<int>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426aa4);
    local_8 = internal::PackedSInt32Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426abc);
    break;
  case (InternalMetadataWithArena *)0x11:
    Reflection::MutableRepeatedField<long>
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (FieldDescriptor *)0x426ae6);
    local_8 = internal::PackedSInt64Parser
                        (in_stack_ffffffffffffff30,
                         (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (ParseContext *)0x426afe);
  }
  return local_8;
}

Assistant:

const char* ParsePackedField(const FieldDescriptor* field, Message* msg,
                             const Reflection* reflection, const char* ptr,
                             internal::ParseContext* ctx) {
  switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, METHOD_NAME) \
  case FieldDescriptor::TYPE_##TYPE:                   \
    return internal::Packed##METHOD_NAME##Parser(      \
        reflection->MutableRepeatedField<CPPTYPE>(msg, field), ptr, ctx)
    HANDLE_PACKED_TYPE(INT32, int32, Int32);
    HANDLE_PACKED_TYPE(INT64, int64, Int64);
    HANDLE_PACKED_TYPE(SINT32, int32, SInt32);
    HANDLE_PACKED_TYPE(SINT64, int64, SInt64);
    HANDLE_PACKED_TYPE(UINT32, uint32, UInt32);
    HANDLE_PACKED_TYPE(UINT64, uint64, UInt64);
    HANDLE_PACKED_TYPE(BOOL, bool, Bool);
    case FieldDescriptor::TYPE_ENUM: {
      auto object =
          internal::ReflectionAccessor::GetRepeatedEnum(reflection, field, msg);
      if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        return internal::PackedEnumParser(object, ptr, ctx);
      } else {
        return internal::PackedEnumParserArg(
            object, ptr, ctx, ReflectiveValidator, field->enum_type(),
            internal::ReflectionAccessor::MutableInternalMetadataWithArena(
                reflection, msg),
            field->number());
      }
    }
      HANDLE_PACKED_TYPE(FIXED32, uint32, Fixed32);
      HANDLE_PACKED_TYPE(FIXED64, uint64, Fixed64);
      HANDLE_PACKED_TYPE(SFIXED32, int32, SFixed32);
      HANDLE_PACKED_TYPE(SFIXED64, int64, SFixed64);
      HANDLE_PACKED_TYPE(FLOAT, float, Float);
      HANDLE_PACKED_TYPE(DOUBLE, double, Double);
#undef HANDLE_PACKED_TYPE

    default:
      GOOGLE_LOG(FATAL) << "Type is not packable " << field->type();
      return nullptr;  // Make compiler happy
  }
}